

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_io.c
# Opt level: O0

int IDASetMaxOrd(void *ida_mem,int maxord)

{
  int in_ESI;
  IDAMem in_RDI;
  int maxord_alloc;
  IDAMem IDA_mem;
  int local_28;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0xdc,"IDASetMaxOrd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_io.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_ESI < 1) {
    IDAProcessError(in_RDI,-0x16,0xe4,"IDASetMaxOrd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_io.c"
                    ,"maxord <= 0 illegal.");
    local_4 = -0x16;
  }
  else if (in_RDI->ida_maxord_alloc < in_ESI) {
    IDAProcessError(in_RDI,-0x16,0xef,"IDASetMaxOrd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_io.c"
                    ,"Illegal attempt to increase maximum order.");
    local_4 = -0x16;
  }
  else {
    local_28 = in_ESI;
    if (4 < in_ESI) {
      local_28 = 5;
    }
    in_RDI->ida_maxord = local_28;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDASetMaxOrd(void* ida_mem, int maxord)
{
  IDAMem IDA_mem;
  int maxord_alloc;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (maxord <= 0)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NEG_MAXORD);
    return (IDA_ILL_INPUT);
  }

  /* Cannot increase maximum order beyond the value that
     was used when allocating memory */
  maxord_alloc = IDA_mem->ida_maxord_alloc;

  if (maxord > maxord_alloc)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_MAXORD);
    return (IDA_ILL_INPUT);
  }

  IDA_mem->ida_maxord = SUNMIN(maxord, MAXORD_DEFAULT);

  return (IDA_SUCCESS);
}